

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O1

void __thiscall SAT::btToPos(SAT *this,int sat_pos,int core_pos)

{
  vec<Lit> *pvVar1;
  vec<Lit> *pvVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  pvVar2 = (this->trail).data;
  uVar3 = (this->trail).sz - 1;
  pvVar1 = pvVar2 + uVar3;
  uVar3 = pvVar2[uVar3].sz;
  uVar5 = (ulong)uVar3;
  if (sat_pos < (int)uVar3) {
    do {
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
      uVar3 = pvVar1->data[uVar5].x >> 1;
      (this->assigns).data[uVar3] = ::l_Undef.value;
      if ((((int)(this->order_heap).indices.sz <= (int)uVar3) ||
          ((this->order_heap).indices.data[uVar3] < 0)) &&
         (((uint)(this->flags).data[uVar3] & 1) != 0)) {
        Heap<SAT::VarOrderLt>::insert(&this->order_heap,uVar3);
      }
    } while (sat_pos < (int)uVar4);
  }
  pvVar1->sz = sat_pos;
  Engine::btToPos(&engine,core_pos);
  return;
}

Assistant:

void SAT::btToPos(int sat_pos, int core_pos) {
	untrailToPos(trail.last(), sat_pos);
	engine.btToPos(core_pos);
}